

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool ssl_cf_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 uVar1;
  _Bool _Var2;
  _Bool _Var3;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
  *(Curl_easy **)((long)cf->ctx + 0x38) = data;
  _Var2 = (*Curl_ssl->data_pending)(cf,data);
  _Var3 = true;
  if (!_Var2) {
    _Var3 = (*cf->next->cft->has_data_pending)(cf->next,data);
  }
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
  return _Var3;
}

Assistant:

static bool ssl_cf_data_pending(struct Curl_cfilter *cf,
                                const struct Curl_easy *data)
{
  struct cf_call_data save;
  bool result;

  CF_DATA_SAVE(save, cf, data);
  if(Curl_ssl->data_pending(cf, data))
    result = TRUE;
  else
    result = cf->next->cft->has_data_pending(cf->next, data);
  CF_DATA_RESTORE(cf, save);
  return result;
}